

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O0

DdNode * cuddHashTableLookup2(DdHashTable *hash,DdNode *f,DdNode *g)

{
  DdNode *pDVar1;
  uint uVar2;
  DdNode *value;
  DdNodePtr *key;
  DdHashItem *prev;
  DdHashItem *item;
  uint posn;
  DdNode *g_local;
  DdNode *f_local;
  DdHashTable *hash_local;
  
  uVar2 = (((uint)(*(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) << 1) | (uint)f & 1) * 0xc00005
          + ((uint)(*(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) << 1) | (uint)g & 1)) *
          0x40f1f9 >> ((byte)hash->shift & 0x1f);
  prev = hash->bucket[uVar2];
  key = (DdNodePtr *)0x0;
  while( true ) {
    if (prev == (DdHashItem *)0x0) {
      return (DdNode *)0x0;
    }
    if ((f == prev->key[0]) && (g == (DdNode *)prev[1].next)) break;
    key = (DdNodePtr *)prev;
    prev = prev->next;
  }
  pDVar1 = prev->value;
  prev->count = prev->count + -1;
  if (prev->count != 0) {
    return pDVar1;
  }
  *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
       *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
  if (key == (DdNodePtr *)0x0) {
    hash->bucket[uVar2] = prev->next;
  }
  else {
    *key = (DdNodePtr)prev->next;
  }
  prev->next = hash->nextFree;
  hash->nextFree = prev;
  hash->size = hash->size - 1;
  return pDVar1;
}

Assistant:

DdNode *
cuddHashTableLookup2(
  DdHashTable * hash,
  DdNode * f,
  DdNode * g)
{
    unsigned int posn;
    DdHashItem *item, *prev;

#ifdef DD_DEBUG
    assert(hash->keysize == 2);
#endif

    posn = ddLCHash2(cuddF2L(f),cuddF2L(g),hash->shift);
    item = hash->bucket[posn];
    prev = NULL;

    while (item != NULL) {
        DdNodePtr *key = item->key;
        if ((f == key[0]) && (g == key[1])) {
            DdNode *value = item->value;
            cuddSatDec(item->count);
            if (item->count == 0) {
                cuddDeref(value);
                if (prev == NULL) {
                    hash->bucket[posn] = item->next;
                } else {
                    prev->next = item->next;
                }
                item->next = hash->nextFree;
                hash->nextFree = item;
                hash->size--;
            }
            return(value);
        }
        prev = item;
        item = item->next;
    }
    return(NULL);

}